

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-after-read-timeout.c
# Opt level: O3

void on_client_connect(uv_connect_t *conn_req,int status)

{
  int iVar1;
  undefined8 *extraout_RDX;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 local_10;
  long local_8;
  
  iVar1 = uv_read_start(&client,on_client_alloc,on_client_read);
  local_8 = (long)iVar1;
  local_10 = 0;
  if (local_8 == 0) {
    iVar1 = uv_timer_start(&timer,on_client_timeout,1000,0);
    local_8 = (long)iVar1;
    local_10 = 0;
    if (local_8 == 0) {
      return;
    }
  }
  else {
    on_client_connect_cold_1();
  }
  iVar1 = (int)&local_10;
  on_client_connect_cold_2();
  if (iVar1 == 0) {
    iVar1 = uv_accept();
    if (iVar1 == 0) {
      iVar1 = uv_read_start(&connection,on_connection_alloc,on_connection_read);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001c8d49;
    }
  }
  else {
    on_connection_cold_1();
  }
  on_connection_cold_2();
LAB_001c8d49:
  on_connection_cold_3();
  *extraout_RDX = on_connection_alloc::slab;
  extraout_RDX[1] = 8;
  return;
}

Assistant:

static void on_client_connect(uv_connect_t* conn_req, int status) {
  int r;

  r = uv_read_start((uv_stream_t*) &client, on_client_alloc, on_client_read);
  ASSERT_OK(r);

  r = uv_timer_start(&timer, on_client_timeout, 1000, 0);
  ASSERT_OK(r);
}